

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void cf_sha256_digest(cf_sha256_context *ctx,uint8_t *hash)

{
  long lVar1;
  cf_sha256_context *pcVar2;
  cf_sha256_context ours;
  cf_sha256_context local_70;
  
  pcVar2 = &local_70;
  for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined8 *)pcVar2->H = *(undefined8 *)ctx->H;
    ctx = (cf_sha256_context *)(ctx->H + 2);
    pcVar2 = (cf_sha256_context *)(pcVar2->H + 2);
  }
  cf_sha256_digest_final(&local_70,hash);
  return;
}

Assistant:

void cf_sha256_digest(const cf_sha256_context *ctx, uint8_t hash[CF_SHA256_HASHSZ])
{
  /* We copy the context, so the finalisation doesn't effect the caller's
   * context.  This means the caller can do:
   *
   * x = init()
   * x.update('hello')
   * h1 = x.digest()
   * x.update(' world')
   * h2 = x.digest()
   *
   * to get h1 = H('hello') and h2 = H('hello world')
   *
   * This wouldn't work if we applied MD-padding to *ctx.
   */

  cf_sha256_context ours = *ctx;
  cf_sha256_digest_final(&ours, hash);
}